

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O2

FArchive * operator<<(FArchive *arc,secplane_t *plane)

{
  double dVar1;
  FArchive *this;
  
  this = operator<<(arc,&plane->normal);
  FArchive::operator<<(this,&plane->D);
  dVar1 = (plane->normal).Z;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    plane->negiC = -1.0 / dVar1;
  }
  return arc;
}

Assistant:

FArchive &operator<< (FArchive &arc, secplane_t &plane)
{
	arc << plane.normal << plane.D;
	if (plane.normal.Z != 0)
	{	// plane.c should always be non-0. Otherwise, the plane
		// would be perfectly vertical. (But then, don't let this crash on a broken savegame...)
		plane.negiC = -1 / plane.normal.Z;
	}
	return arc;
}